

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RandJoinClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RandJoinClauseSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ParenthesizedExpressionSyntax*>
          (BumpAllocator *this,Token *args,Token *args_1,ParenthesizedExpressionSyntax **args_2)

{
  Token join;
  Token rand;
  ParenthesizedExpressionSyntax *expr;
  Info *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  expr = (ParenthesizedExpressionSyntax *)
         allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  rand.info = in_RCX;
  rand._0_8_ = in_RSI[1];
  join.info = (Info *)*in_RSI;
  join._0_8_ = in_RDX[1];
  slang::syntax::RandJoinClauseSyntax::RandJoinClauseSyntax
            ((RandJoinClauseSyntax *)*in_RDX,rand,join,expr);
  return (RandJoinClauseSyntax *)expr;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }